

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive_buffer.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::crypto_receive_buffer::reset(crypto_receive_buffer *this,int packet_size)

{
  receive_buffer *this_00;
  
  this_00 = this->m_connection_buffer;
  if (this->m_recv_pos != 0x7fffffff) {
    if (this->m_packet_size < this_00->m_recv_end) {
      cut(this,this->m_packet_size,packet_size,0);
      return;
    }
    this->m_packet_size = packet_size;
    packet_size = this_00->m_packet_size - this->m_recv_pos;
    this->m_recv_pos = 0;
  }
  receive_buffer::reset(this_00,packet_size);
  return;
}

Assistant:

void crypto_receive_buffer::reset(int packet_size)
{
	if (m_recv_pos != INT_MAX)
	{
		if (m_connection_buffer.m_recv_end > m_packet_size)
		{
			cut(m_packet_size, packet_size);
			return;
		}
		m_packet_size = packet_size;
		packet_size = m_connection_buffer.packet_size() - m_recv_pos;
		m_recv_pos = 0;
	}
	m_connection_buffer.reset(packet_size);
}